

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queue_generic_tests.h
# Opt level: O2

reentrant_put_transaction<void> *
density_tests::detail::
PutInt<density::sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>_>
::reentrant_put(reentrant_put_transaction<void> *__return_storage_ptr__,
               conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>
               *i_queue,EasyRandom *param_2)

{
  reentrant_put_transaction<int>_conflict transaction;
  int local_5c;
  reentrant_put_transaction<int> local_58;
  reentrant_put_transaction<int> local_38;
  
  local_5c = 1;
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::start_reentrant_push<int>
            (&local_38,
             (sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
              *)i_queue,&local_5c);
  local_58.m_put.m_user_storage = local_38.m_put.m_user_storage;
  local_58.m_put.m_control_block = local_38.m_put.m_control_block;
  local_58.m_put.m_next_ptr = local_38.m_put.m_next_ptr;
  local_58.m_queue = local_38.m_queue;
  local_38.m_put.m_user_storage = (void *)0x0;
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::reentrant_put_transaction<int>::~reentrant_put_transaction(&local_38);
  exception_checkpoint();
  (__return_storage_ptr__->m_put).m_user_storage = local_58.m_put.m_user_storage;
  (__return_storage_ptr__->m_put).m_control_block = local_58.m_put.m_control_block;
  (__return_storage_ptr__->m_put).m_next_ptr = local_58.m_put.m_next_ptr;
  __return_storage_ptr__->m_queue =
       (conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>
        *)local_38.m_queue;
  local_58.m_put.m_user_storage = (void *)0x0;
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::reentrant_put_transaction<int>::~reentrant_put_transaction(&local_58);
  return __return_storage_ptr__;
}

Assistant:

static typename QUEUE::template reentrant_put_transaction<void>
              reentrant_put(QUEUE & i_queue, EasyRandom &)
            {
                auto transaction = i_queue.start_reentrant_push(1);
                exception_checkpoint();
                return std::move(transaction);
            }